

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory_Banks.c
# Opt level: O2

void gb_write_mbc_1(MemoryBankController *mc,uint16_t address,uint8_t data)

{
  short sVar1;
  uint uVar2;
  uint16_t uVar3;
  uint uVar4;
  undefined6 in_register_00000032;
  
  uVar4 = (uint)CONCAT62(in_register_00000032,address);
  uVar2 = uVar4 & 0xe000;
  sVar1 = (short)uVar2;
  if (sVar1 == 0x4000) {
    mc->banking_register_2 = data & 3;
  }
  else {
    if (uVar2 == 0x2000) {
      uVar2 = (uint)(data & 0x1f) & mc->rom_bank_mask;
      uVar3 = 1;
      if (uVar2 != 0) {
        uVar3 = (uint16_t)uVar2;
      }
      mc->banking_register_1 = uVar3;
      return;
    }
    if (0x5fff < (short)address) {
      mc->banking_mode = (uint)(data == '\x01');
      return;
    }
    if (sVar1 != -0x6000) {
      if ((ushort)(address + 0x2000) < 0x1e00) {
        mc->memory[address] = data;
        (*mc->write)(mc,address + 0xe000,data);
        return;
      }
      gb_common_writes(mc,address,data);
      return;
    }
    if (mc->ram_enabled == true) {
      if (mc->banking_mode == Banking_Mode_ROM) {
        uVar2 = 0;
      }
      else {
        uVar2 = (uint)mc->banking_register_2;
      }
      mc->ram[(uVar2 & mc->ram_bank_mask) << 0xd | uVar4 - 0xa000] = data;
      return;
    }
  }
  return;
}

Assistant:

void gb_write_mbc_1(MemoryBankController* mc, uint16_t address, uint8_t data) {

    if (address >= 0x2000 && address <= 0x3FFF) {
        gb_set_rom_bank_number(mc, data, 0x1F);
        return;
    } 
    
    if (address >= 0x4000 && address <= 0x5FFF) {
        gb_set_ram_bank_number(mc, data);
        return;
    } 
    
    if (address >= 0x6000 && address <= 0x7FFF) {
        gb_set_banking_mode(mc, data);
        return;
    } 

    if (address >= 0xA000 && address <= 0xBFFF) {
        if(mc->ram_enabled) {
            int offset = address - 0xA000;
            int ram_bank = mc->banking_mode == Banking_Mode_ROM ? 0 : (mc->banking_register_2);
            int write_addr = offset + (ram_bank & mc->ram_bank_mask) * RAM_BANK_SIZE;
            mc->ram[write_addr] = data;
        }
        return;
    }
    
    if (address >= 0xE000 && address < 0xFE00) {
        mc->memory[address] = data;
        mc->write(mc, (uint16_t) (address - 0x2000), data);
        return;
    }

    gb_common_writes(mc, address, data);
}